

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall kwssys::RegularExpression::compile(RegularExpression *this,char *exp)

{
  char *pcVar1;
  char *pcVar2;
  long in_RSI;
  RegularExpressionMatch *in_RDI;
  int *piVar3;
  size_t len;
  RegExpCompile comp;
  int flags;
  char *longest;
  char *scan;
  char *local_58;
  int local_48;
  char *local_40;
  int *flagp;
  uint in_stack_ffffffffffffffd4;
  RegExpCompile *in_stack_ffffffffffffffd8;
  char *local_20;
  bool local_1;
  
  if (in_RSI == 0) {
    printf("RegularExpression::compile(): No expression supplied.\n");
    local_1 = false;
  }
  else {
    local_48 = 1;
    flagp = (int *)0x0;
    local_40 = &regdummy;
    RegExpCompile::regc((RegExpCompile *)&stack0xffffffffffffffb0,-100);
    pcVar1 = RegExpCompile::reg(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,flagp);
    if (pcVar1 == (char *)0x0) {
      printf("RegularExpression::compile(): Error in compile.\n");
      local_1 = false;
    }
    else {
      RegularExpressionMatch::clear(in_RDI);
      if ((long)flagp < 0xffff) {
        if (in_RDI[1].startp[3] != (char *)0x0) {
          operator_delete__(in_RDI[1].startp[3]);
        }
        piVar3 = flagp;
        if ((long)flagp < 0) {
          piVar3 = (int *)0xffffffffffffffff;
        }
        pcVar1 = (char *)operator_new__((ulong)piVar3);
        in_RDI[1].startp[3] = pcVar1;
        *(int *)(in_RDI[1].startp + 4) = (int)flagp;
        if (in_RDI[1].startp[3] == (char *)0x0) {
          printf("RegularExpression::compile(): Out of memory.\n");
          local_1 = false;
        }
        else {
          local_48 = 1;
          local_40 = in_RDI[1].startp[3];
          RegExpCompile::regc((RegExpCompile *)&stack0xffffffffffffffb0,-100);
          RegExpCompile::reg(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,flagp);
          *(undefined1 *)in_RDI[1].startp = 0;
          *(undefined1 *)((long)in_RDI[1].startp + 1) = 0;
          in_RDI[1].startp[1] = (char *)0x0;
          in_RDI[1].startp[2] = (char *)0x0;
          pcVar1 = in_RDI[1].startp[3];
          pcVar2 = regnext(pcVar1 + 1);
          if (*pcVar2 == '\0') {
            local_20 = pcVar1 + 4;
            if (*local_20 == '\b') {
              *(char *)in_RDI[1].startp = pcVar1[7];
            }
            else if (*local_20 == '\x01') {
              *(char *)((long)in_RDI[1].startp + 1) = *(char *)((long)in_RDI[1].startp + 1) + '\x01'
              ;
            }
            if ((in_stack_ffffffffffffffd4 & 4) != 0) {
              pcVar1 = (char *)0x0;
              local_58 = (char *)0x0;
              for (; local_20 != (char *)0x0; local_20 = regnext(local_20)) {
                if ((*local_20 == '\b') &&
                   (pcVar2 = (char *)strlen(local_20 + 3), local_58 <= pcVar2)) {
                  pcVar1 = local_20 + 3;
                  local_58 = (char *)strlen(local_20 + 3);
                }
              }
              in_RDI[1].startp[1] = pcVar1;
              in_RDI[1].startp[2] = local_58;
            }
          }
          local_1 = true;
        }
      }
      else {
        printf("RegularExpression::compile(): Expression too big.\n");
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool RegularExpression::compile(const char* exp)
{
  const char* scan;
  const char* longest;
  int flags;

  if (exp == nullptr) {
    // RAISE Error, SYM(RegularExpression), SYM(No_Expr),
    printf("RegularExpression::compile(): No expression supplied.\n");
    return false;
  }

  // First pass: determine size, legality.
  RegExpCompile comp;
  comp.regparse = exp;
  comp.regnpar = 1;
  comp.regsize = 0L;
  comp.regcode = regdummyptr;
  comp.regc(static_cast<char>(MAGIC));
  if (!comp.reg(0, &flags)) {
    printf("RegularExpression::compile(): Error in compile.\n");
    return false;
  }
  this->regmatch.clear();

  // Small enough for pointer-storage convention?
  if (comp.regsize >= 65535L) {
    // RAISE Error, SYM(RegularExpression), SYM(Expr_Too_Big),
    printf("RegularExpression::compile(): Expression too big.\n");
    return false;
  }

  // Allocate space.
  // #ifndef _WIN32
  delete[] this->program;
  // #endif
  this->program = new char[comp.regsize];
  this->progsize = static_cast<int>(comp.regsize);

  if (this->program == nullptr) {
    // RAISE Error, SYM(RegularExpression), SYM(Out_Of_Memory),
    printf("RegularExpression::compile(): Out of memory.\n");
    return false;
  }

#ifdef __clang_analyzer__ /* Convince it that the program is initialized.  */
  memset(this->program, 0, comp.regsize);
#endif

  // Second pass: emit code.
  comp.regparse = exp;
  comp.regnpar = 1;
  comp.regcode = this->program;
  comp.regc(static_cast<char>(MAGIC));
  comp.reg(0, &flags);

  // Dig out information for optimizations.
  this->regstart = '\0'; // Worst-case defaults.
  this->reganch = 0;
  this->regmust = nullptr;
  this->regmlen = 0;
  scan = this->program + 1;       // First BRANCH.
  if (OP(regnext(scan)) == END) { // Only one top-level choice.
    scan = OPERAND(scan);

    // Starting-point info.
    if (OP(scan) == EXACTLY)
      this->regstart = *OPERAND(scan);
    else if (OP(scan) == BOL)
      this->reganch++;

    //
    // If there's something expensive in the r.e., find the longest
    // literal string that must appear and make it the regmust.  Resolve
    // ties in favor of later strings, since the regstart check works
    // with the beginning of the r.e. and avoiding duplication
    // strengthens checking.  Not a strong reason, but sufficient in the
    // absence of others.
    //
    if (flags & SPSTART) {
      longest = nullptr;
      size_t len = 0;
      for (; scan != nullptr; scan = regnext(scan))
        if (OP(scan) == EXACTLY && strlen(OPERAND(scan)) >= len) {
          longest = OPERAND(scan);
          len = strlen(OPERAND(scan));
        }
      this->regmust = longest;
      this->regmlen = len;
    }
  }
  return true;
}